

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

void __thiscall
nigel::IMC_Generator::generateUnaryROperation
          (IMC_Generator *this,OperationType comb,HexOp op_acc,shared_ptr<nigel::IM_Operator> *op,
          shared_ptr<nigel::Token> *token)

{
  int iVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined1 local_241;
  undefined1 local_240 [24];
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::Token> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_40;
  shared_ptr<nigel::IM_Operator> local_30;
  
  if (comb == t) {
    local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_acc,&local_1b8,&local_1c8);
    if (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return;
    }
  }
  else {
    if (comb == c) {
      local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      BuilderExecutable::generateNotification
                (&this->super_BuilderExecutable,imp_operationOnConstantCanBePrevented,&local_218);
      if (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,&local_228,&local_188);
      if (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_acc,&local_198,&local_1a8);
      this_00._M_pi =
           local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_00._M_pi =
             local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
    else {
      if (comb != v) {
        return;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_240);
      iVar1 = *(int *)(local_240._0_8_ + 0x1c);
      if ((element_type *)local_240._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
      }
      if (iVar1 == 0) {
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_adr,&local_1d8,&local_58);
        if (local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_acc,&local_68,&local_78);
        if (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if ((element_type *)
            local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_1e8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_1e8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_1e8,&local_88);
        this_00._M_pi =
             local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_240);
        iVar1 = *(int *)(local_240._0_8_ + 0x1c);
        if ((element_type *)local_240._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
        }
        if (iVar1 == 1) {
          local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_dptr_const,&local_1f8,&local_98);
          if (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,movx_a_dptr,&local_a8,&local_b8);
          if (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_240._20_4_ = 0xf0;
          std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                    ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_240,
                     (allocator<nigel::IM_SFR> *)&local_241,(SFR *)(local_240 + 0x14));
          uVar2 = local_240._8_8_;
          local_30.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_240._0_8_;
          local_30.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_;
          local_240._0_8_ = (element_type *)0x0;
          local_240._8_8_ = (element_type *)0x0;
          local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_adr_a,&local_30,&local_c8);
          if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)uVar2 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          }
          if ((element_type *)local_240._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
          }
          local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,op_acc,&local_d8,&local_e8);
          if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,movx_dptr_a,&local_f8,&local_108);
          if (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_240._20_4_ = 0xf0;
          std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                    ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_240,
                     (allocator<nigel::IM_SFR> *)&local_241,(SFR *)(local_240 + 0x14));
          uVar2 = local_240._8_8_;
          local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_240._0_8_;
          local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_;
          local_240._0_8_ = (element_type *)0x0;
          local_240._8_8_ = (element_type *)0x0;
          local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_a_adr,&local_40,&local_118);
          if (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_;
          if ((element_type *)uVar2 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
            this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_;
          }
        }
        else {
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_240);
          iVar1 = *(int *)(local_240._0_8_ + 0x1c);
          if ((element_type *)local_240._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
          }
          if ((iVar1 != 4) && (iVar1 != 2)) {
            return;
          }
          local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          generateLoadStackR0(this,&local_208);
          if (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_a_atr0,&local_128,&local_138);
          if (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,op_acc,&local_148,&local_158);
          if (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,xch_a_atr0,&local_168,&local_178);
          this_00._M_pi =
               local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            this_00._M_pi =
                 local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
        }
      }
    }
    if ((element_type *)this_00._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  return;
}

Assistant:

void IMC_Generator::generateUnaryROperation( OperationType comb, HexOp op_acc, std::shared_ptr<IM_Operator> op, std::shared_ptr<Token> token )
	{
		if( comb == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
				addCmd( op_acc );
				addCmd( HexOp::xch_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( op_acc );
				addCmd( HexOp::movx_dptr_a );
				addCmd( HexOp::mov_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_acc );
				addCmd( HexOp::xch_a_atr0 );
			}
		}
		else if( comb == OT::c )
		{
			generateNotification( NT::imp_operationOnConstantCanBePrevented, token );
			addCmd( HexOp::mov_a_const, op );
			addCmd( op_acc );
		}
		else if( comb == OT::t )
		{
			addCmd( op_acc );
		}
	}